

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O3

void __thiscall
ScriptElement_ConvertBinaryToNumber_Test::~ScriptElement_ConvertBinaryToNumber_Test
          (ScriptElement_ConvertBinaryToNumber_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptElement, ConvertBinaryToNumber) {
  ScriptElement bi_num_elem = ScriptElement(ByteData("ff7f"));
  int64_t converted = 0;
  EXPECT_TRUE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(32767, converted);

  bi_num_elem = ScriptElement(ByteData("ffffffffffff"));
  converted = 0;
  EXPECT_FALSE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(0, converted);

  bi_num_elem = ScriptElement(ScriptOperator::OP_12);
  converted = 0;
  EXPECT_FALSE(bi_num_elem.ConvertBinaryToNumber(&converted));
  EXPECT_EQ(0, converted);
}